

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::mdc_formatter<spdlog::details::scoped_padder>::format_mdc
          (mdc_formatter<spdlog::details::scoped_padder> *this,mdc_map_t *mdc_map,memory_buf_t *dest
          )

{
  string_view_t view;
  string_view_t view_00;
  string_view_t view_01;
  string_view_t view_02;
  bool bVar1;
  _Self *p_Var2;
  reference this_00;
  memory_buf_t *in_RDI;
  scoped_padder p;
  size_t content_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  const_iterator it;
  _Self last_element;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  scoped_padder *in_stack_ffffffffffffff20;
  memory_buf_t *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  scoped_padder *in_stack_ffffffffffffff40;
  _Self local_38;
  _Self local_30;
  _Base_ptr local_28;
  _Self local_20 [4];
  
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffff18);
  p_Var2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator--((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffff20);
  local_20[0]._M_node = p_Var2->_M_node;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff18);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff18);
    bVar1 = std::operator==(&local_30,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff20 =
         (scoped_padder *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                   (&this_00->first);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (&this_00->second);
    std::operator==(&local_30,local_20);
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38,
               (padding_info *)in_stack_ffffffffffffff30,in_RDI);
    fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    view.size_ = (size_t)in_stack_ffffffffffffff40;
    view.data_ = in_stack_ffffffffffffff38;
    fmt_helper::append_string_view(view,in_stack_ffffffffffffff30);
    fmt::v11::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_RDI,(char *)in_stack_ffffffffffffff20);
    view_00.size_ = (size_t)in_stack_ffffffffffffff40;
    view_00.data_ = in_stack_ffffffffffffff38;
    fmt_helper::append_string_view(view_00,in_stack_ffffffffffffff30);
    fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    view_01.size_ = (size_t)in_stack_ffffffffffffff40;
    view_01.data_ = in_stack_ffffffffffffff38;
    fmt_helper::append_string_view(view_01,in_stack_ffffffffffffff30);
    bVar1 = std::operator==(&local_30,local_20);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      fmt::v11::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_RDI,(char *)in_stack_ffffffffffffff20);
      view_02.size_ = (size_t)in_stack_ffffffffffffff40;
      view_02.data_ = in_stack_ffffffffffffff38;
      fmt_helper::append_string_view(view_02,in_stack_ffffffffffffff30);
    }
    scoped_padder::~scoped_padder(in_stack_ffffffffffffff20);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void format_mdc(const mdc::mdc_map_t &mdc_map, memory_buf_t &dest) {
        auto last_element = --mdc_map.end();
        for (auto it = mdc_map.begin(); it != mdc_map.end(); ++it) {
            auto &pair = *it;
            const auto &key = pair.first;
            const auto &value = pair.second;
            size_t content_size = key.size() + value.size() + 1;  // 1 for ':'

            if (it != last_element) {
                content_size++;  // 1 for ' '
            }

            ScopedPadder p(content_size, padinfo_, dest);
            fmt_helper::append_string_view(key, dest);
            fmt_helper::append_string_view(":", dest);
            fmt_helper::append_string_view(value, dest);
            if (it != last_element) {
                fmt_helper::append_string_view(" ", dest);
            }
        }
    }